

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O0

void __thiscall BoolLinearLE<0>::BoolLinearLE(BoolLinearLE<0> *this,vec<BoolView> *_x,IntView<0> _y)

{
  uint uVar1;
  _func_int **in_RCX;
  BoolView *in_RDX;
  BoolView *in_RDI;
  uint i;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vec<BoolView> *in_stack_ffffffffffffffb8;
  Propagator *p;
  Propagator *p_00;
  uint pos;
  uint index;
  undefined4 in_stack_ffffffffffffffd4;
  
  Propagator::Propagator
            ((Propagator *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  (in_RDI->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR__BoolLinearLE_0031bfb8;
  p_00 = (Propagator *)&in_RDI[1].v;
  vec<BoolView>::vec<BoolView>((vec<BoolView> *)in_RDI,in_stack_ffffffffffffffb8);
  *(BoolView **)&in_RDI[2].v = in_RDX;
  in_RDI[3].super_Var.super_Branching._vptr_Branching = in_RCX;
  Tint::Tint((Tint *)&in_RDI[3].v,0);
  p = (Propagator *)(in_RDI + 4);
  vec<Lit>::vec((vec<Lit> *)p);
  pos = 0;
  while( true ) {
    index = pos;
    uVar1 = vec<BoolView>::size((vec<BoolView> *)&in_RDI[1].v);
    if (uVar1 <= pos) break;
    vec<BoolView>::operator[]((vec<BoolView> *)&in_RDI[1].v,index);
    BoolView::attach(in_RDI,p,pos,in_stack_ffffffffffffffb0);
    pos = index + 1;
  }
  vec<BoolView>::size((vec<BoolView> *)&in_RDI[1].v);
  IntView<0>::attach((IntView<0> *)CONCAT44(in_stack_ffffffffffffffd4,index),p_00,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

BoolLinearLE(vec<BoolView>& _x, IntView<U> _y) : x(_x), y(_y), ones(0) {
		for (unsigned int i = 0; i < x.size(); i++) {
			x[i].attach(this, i, EVENT_L);
		}
		y.attach(this, x.size(), EVENT_U);
	}